

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void ilu_set_default_options(superlu_options_t *options)

{
  superlu_options_t *options_local;
  
  set_default_options(options);
  options->DiagPivotThresh = 0.1;
  options->RowPerm = LargeDiag_MC64;
  options->ILU_DropRule = 9;
  options->ILU_DropTol = 0.0001;
  options->ILU_FillFactor = 10.0;
  options->ILU_Norm = INF_NORM;
  options->ILU_MILU = SILU;
  options->ILU_MILU_Dim = 3.0;
  options->ILU_FillTol = 0.01;
  return;
}

Assistant:

void ilu_set_default_options(superlu_options_t *options)
{
    set_default_options(options);

    /* further options for incomplete factorization */
    options->DiagPivotThresh = 0.1;
    options->RowPerm = LargeDiag_MC64;
    options->ILU_DropRule = DROP_BASIC | DROP_AREA;
    options->ILU_DropTol = 1e-4;
    options->ILU_FillFactor = 10.0;
    options->ILU_Norm = INF_NORM;
    options->ILU_MILU = SILU;
    options->ILU_MILU_Dim = 3.0; /* -log(n)/log(h) is perfect */
    options->ILU_FillTol = 1e-2;
}